

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_picker.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::hash_picker::verify_block_hashes(hash_picker *this,piece_index_t index)

{
  bool bVar1;
  file_index_t f;
  __normal_iterator<libtorrent::aux::hash_picker::piece_block_request_*,_std::vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>_>
  local_80;
  const_iterator local_78;
  __normal_iterator<libtorrent::aux::hash_picker::piece_block_request_*,_std::vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>_>
  local_70;
  piece_block_request *local_68;
  __normal_iterator<libtorrent::aux::hash_picker::piece_block_request_*,_std::vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>_>
  local_60;
  __normal_iterator<libtorrent::aux::hash_picker::piece_block_request_*,_std::vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>_>
  local_58;
  int local_50;
  int local_4c;
  undefined1 local_48 [8];
  piece_block_request req;
  diff_type piece;
  file_index_t fidx;
  hash_picker *this_local;
  piece_index_t index_local;
  
  f = file_storage::file_index_at_piece(this->m_files,index);
  req.num_requests = f.m_val;
  req._20_4_ = file_storage::piece_index_at_file(this->m_files,f);
  local_50 = (int)aux::operator-(index.m_val,
                                 (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)
                                 req._20_4_);
  local_4c = f.m_val;
  piece_block_request::piece_block_request((piece_block_request *)local_48,f,(diff_type)local_50);
  local_60._M_current =
       (piece_block_request *)
       ::std::
       vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
       ::begin(&(this->m_piece_block_requests).
                super_vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
              );
  local_68 = (piece_block_request *)
             ::std::
             vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
             ::end(&(this->m_piece_block_requests).
                    super_vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
                  );
  local_58 = ::std::
             find<__gnu_cxx::__normal_iterator<libtorrent::aux::hash_picker::piece_block_request*,std::vector<libtorrent::aux::hash_picker::piece_block_request,std::allocator<libtorrent::aux::hash_picker::piece_block_request>>>,libtorrent::aux::hash_picker::piece_block_request>
                       (local_60,(__normal_iterator<libtorrent::aux::hash_picker::piece_block_request_*,_std::vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>_>
                                  )local_68,(piece_block_request *)local_48);
  local_70._M_current =
       (piece_block_request *)
       ::std::
       vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
       ::end(&(this->m_piece_block_requests).
              super_vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
            );
  bVar1 = __gnu_cxx::operator!=(&local_58,&local_70);
  if (!bVar1) {
    local_80._M_current =
         (piece_block_request *)
         ::std::
         vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
         ::begin(&(this->m_piece_block_requests).
                  super_vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
                );
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::hash_picker::piece_block_request_const*,std::vector<libtorrent::aux::hash_picker::piece_block_request,std::allocator<libtorrent::aux::hash_picker::piece_block_request>>>
    ::__normal_iterator<libtorrent::aux::hash_picker::piece_block_request*>
              ((__normal_iterator<libtorrent::aux::hash_picker::piece_block_request_const*,std::vector<libtorrent::aux::hash_picker::piece_block_request,std::allocator<libtorrent::aux::hash_picker::piece_block_request>>>
                *)&local_78,&local_80);
    ::std::
    vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
    ::insert(&(this->m_piece_block_requests).
              super_vector<libtorrent::aux::hash_picker::piece_block_request,_std::allocator<libtorrent::aux::hash_picker::piece_block_request>_>
             ,local_78,(value_type *)local_48);
  }
  return;
}

Assistant:

void hash_picker::verify_block_hashes(piece_index_t const index)
	{
		file_index_t const fidx = m_files.file_index_at_piece(index);
		piece_index_t::diff_type const piece = index - m_files.piece_index_at_file(fidx);
		piece_block_request req(fidx, piece);

		if (std::find(m_piece_block_requests.begin(), m_piece_block_requests.end(), req)
			!= m_piece_block_requests.end())
			return; // already requested

		m_piece_block_requests.insert(m_piece_block_requests.begin(), req);
	}